

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

void jpc_seglist_insert(jpc_dec_seglist_t *list,jpc_dec_seg_t *ins,jpc_dec_seg_t *node)

{
  jpc_dec_seg_s *local_38;
  jpc_dec_seg_t *next;
  jpc_dec_seg_t *prev;
  jpc_dec_seg_t *node_local;
  jpc_dec_seg_t *ins_local;
  jpc_dec_seglist_t *list_local;
  
  node->prev = ins;
  if (ins == (jpc_dec_seg_t *)0x0) {
    local_38 = (jpc_dec_seg_s *)0x0;
  }
  else {
    local_38 = ins->next;
  }
  node->prev = ins;
  node->next = local_38;
  if (ins == (jpc_dec_seg_t *)0x0) {
    list->head = node;
  }
  else {
    ins->next = node;
  }
  if (local_38 == (jpc_dec_seg_s *)0x0) {
    list->tail = node;
  }
  else {
    local_38->prev = node;
  }
  return;
}

Assistant:

void jpc_seglist_insert(jpc_dec_seglist_t *list, jpc_dec_seg_t *ins, jpc_dec_seg_t *node)
{
	jpc_dec_seg_t *prev;
	jpc_dec_seg_t *next;

	prev = ins;
	node->prev = prev;
	next = prev ? (prev->next) : 0;
	node->prev = prev;
	node->next = next;
	if (prev) {
		prev->next = node;
	} else {
		list->head = node;
	}
	if (next) {
		next->prev = node;
	} else {
		list->tail = node;
	}
}